

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idw.cc
# Opt level: O3

void __thiscall gmath::IDW::add(IDW *this,uint x,uint y,float f,float w)

{
  IDWNode *this_00;
  
  gutil::Semaphore::decrement();
  if (this->root == (IDWNode *)0x0) {
    this_00 = (IDWNode *)operator_new(0x48);
    IDWNode::IDWNode(this_00,x,y,f,w);
  }
  else {
    this_00 = IDWNode::add(this->root,x,y,f,w);
  }
  this->root = this_00;
  gutil::Semaphore::increment();
  return;
}

Assistant:

void IDW::add(unsigned int x, unsigned int y, float f, float w)
{
  gutil::Lock lock(sem);

  if (root == 0)
  {
    root=new IDWNode(x, y, f, w);
  }
  else
  {
    root=root->add(x, y, f, w);
  }
}